

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O2

string * __thiscall
ki::dml::Field<unsigned_short>::get_value_string_abi_cxx11_
          (string *__return_storage_ptr__,Field<unsigned_short> *this)

{
  ostringstream oss;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::ostream::operator<<(local_190,this->m_value);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string Field<ValueT>::get_value_string() const
	{
		std::ostringstream oss;
		oss << m_value;
		return oss.str();
	}